

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

void text_reporter_finish_suite(TestReporter *reporter,char *file,int line)

{
  _Bool _Var1;
  int iVar2;
  TestReporter *in_RDI;
  char prepend [100];
  char buf [1000];
  TextMemo *memo;
  _Bool use_colors;
  char *name;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  byte local_489;
  char local_488 [15];
  undefined1 in_stack_fffffffffffffb87;
  int in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  uint32_t in_stack_fffffffffffffbb0;
  undefined1 local_418 [1000];
  undefined8 *local_30;
  byte local_21;
  char *local_20;
  TestReporter *local_8;
  
  local_8 = in_RDI;
  local_20 = get_current_from_breadcrumb
                       ((CgreenBreadcrumb *)
                        CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  local_489 = 0;
  if (local_8->options != (void *)0x0) {
    local_489 = *local_8->options;
  }
  local_21 = local_489 & 1;
  local_30 = (undefined8 *)local_8->memo;
  reporter_finish_suite
            ((TestReporter *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0);
  local_8->total_passes = local_8->passes + local_8->total_passes;
  local_8->total_failures = local_8->failures + local_8->total_failures;
  local_8->total_skips = local_8->skips + local_8->total_skips;
  local_8->total_exceptions = local_8->exceptions + local_8->total_exceptions;
  _Var1 = have_quiet_mode(local_8);
  if (_Var1) {
    if ((local_21 & 1) != 0) {
      (*(code *)*local_30)("\x1b[32m");
      if (local_8->failures != 0) {
        (*(code *)*local_30)("\x1b[31m");
      }
      if (local_8->exceptions != 0) {
        (*(code *)*local_30)("\x1b[35m");
      }
    }
    if (local_8->exceptions == 0) {
      if (local_8->failures == 0) {
        (*(code *)*local_30)(".");
      }
      else {
        (*(code *)*local_30)("F");
      }
    }
    else {
      (*(code *)*local_30)("X");
    }
    if ((local_21 & 1) != 0) {
      (*(code *)*local_30)("\x1b[0m");
    }
  }
  else {
    sprintf(local_488,"  \"%s\": ",local_20);
    text_reporter_print_results
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
               in_stack_fffffffffffffbb0,(_Bool)in_stack_fffffffffffffb87);
    iVar2 = get_breadcrumb_depth(local_8->breadcrumb);
    if ((((iVar2 != 0) || (local_8->passes != 0)) || (local_8->failures != 0)) ||
       ((local_8->skips != 0 || (local_8->exceptions != 0)))) {
      (*(code *)*local_30)("%s.\n",local_418);
    }
    iVar2 = get_breadcrumb_depth(local_8->breadcrumb);
    if (((iVar2 == 0) && (_Var1 = have_quiet_mode(local_8), !_Var1)) &&
       (_Var1 = inhibit_finish_suite_message(local_8), !_Var1)) {
      sprintf(local_488,"Completed \"%s\": ",local_20);
      text_reporter_print_results
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,
                 in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                 in_stack_fffffffffffffbb0,(_Bool)in_stack_fffffffffffffb87);
      (*(code *)*local_30)("%s.\n",local_418);
    }
  }
  return;
}

Assistant:

static void text_reporter_finish_suite(TestReporter *reporter, const char *file, int line) {
    const char *name = get_current_from_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb);
    bool use_colors = reporter->options && ((TextReporterOptions *)reporter->options)->use_colours;
    TextMemo *memo = (TextMemo *)reporter->memo;

    reporter_finish_suite(reporter, file, line);

    reporter->total_passes += reporter->passes;
    reporter->total_failures += reporter->failures;
    reporter->total_skips += reporter->skips;
    reporter->total_exceptions += reporter->exceptions;

    if (have_quiet_mode(reporter)) {
        if (use_colors) {
            memo->printer(GREEN);
            if (reporter->failures) memo->printer(RED);
            if (reporter->exceptions) memo->printer(MAGENTA);
        }
        if (reporter->exceptions) memo->printer("X");
        else if (reporter->failures) memo->printer("F");
        else memo->printer(".");
        if (use_colors) {
            memo->printer(RESET);
        }
    } else {
        char buf[1000];
        char prepend[100];

        sprintf(prepend, "  \"%s\": ", name);
        text_reporter_print_results(buf, prepend,
                reporter->passes,
                reporter->failures,
                reporter->skips,
                reporter->exceptions,
                reporter->duration,
                use_colors);

        // Don't report top-level (pseudo-suite) if it had no asserts at all
        if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) != 0 ||
                (reporter->passes || reporter->failures || reporter->skips || reporter->exceptions)) {
            memo->printer("%s.\n", buf);
        }

        // Report totals
        if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) == 0) {
            if (!have_quiet_mode(reporter) && !inhibit_finish_suite_message(reporter)) {
                sprintf(prepend, "Completed \"%s\": ", name);
                text_reporter_print_results(buf, prepend,
                                            reporter->total_passes,
                                            reporter->total_failures,
                                            reporter->total_skips,
                                            reporter->total_exceptions,
                                            reporter->total_duration,
                                            use_colors);
                memo->printer("%s.\n", buf);
            }
        }
    }
}